

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::calcEdgeLogDerivativesPartials
          (BeagleCPU4StateImpl<float,_1,_0> *this,float *postOrderPartial,float *preOrderPartial,
          int firstDerivativeIndex,int secondDerivativeIndex,double *categoryRates,
          float *categoryWeights,int scalingFactorsIndex,double *outDerivatives,
          double *outSumDerivatives,double *outSumSquaredDerivatives)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  float *pfVar26;
  float *pfVar27;
  float *pfVar28;
  long lVar29;
  ulong uVar30;
  int iVar31;
  long lVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  
  uVar23 = (this->super_BeagleCPUImpl<float,_1,_0>).kPatternCount;
  uVar24 = (this->super_BeagleCPUImpl<float,_1,_0>).kCategoryCount;
  iVar25 = (this->super_BeagleCPUImpl<float,_1,_0>).kPaddedPatternCount;
  lVar32 = 0;
  iVar31 = 0;
  pfVar26 = (this->super_BeagleCPUImpl<float,_1,_0>).gTransitionMatrices[firstDerivativeIndex];
  for (uVar30 = 0; uVar30 != (~((int)uVar24 >> 0x1f) & uVar24); uVar30 = uVar30 + 1) {
    fVar1 = pfVar26[lVar32];
    fVar2 = pfVar26[lVar32 + 1];
    fVar3 = pfVar26[lVar32 + 2];
    fVar4 = pfVar26[lVar32 + 3];
    fVar5 = pfVar26[lVar32 + 5];
    fVar6 = pfVar26[lVar32 + 6];
    fVar7 = pfVar26[lVar32 + 7];
    fVar8 = pfVar26[lVar32 + 8];
    fVar9 = pfVar26[lVar32 + 10];
    fVar10 = pfVar26[lVar32 + 0xb];
    fVar11 = pfVar26[lVar32 + 0xc];
    fVar12 = pfVar26[lVar32 + 0xd];
    fVar13 = pfVar26[lVar32 + 0xf];
    fVar14 = pfVar26[lVar32 + 0x10];
    fVar15 = pfVar26[lVar32 + 0x11];
    fVar16 = pfVar26[lVar32 + 0x12];
    pfVar27 = (this->super_BeagleCPUImpl<float,_1,_0>).grandDenominatorDerivTmp;
    pfVar28 = (this->super_BeagleCPUImpl<float,_1,_0>).grandNumeratorDerivTmp;
    fVar17 = categoryWeights[uVar30];
    for (lVar29 = 0; (ulong)(~((int)uVar23 >> 0x1f) & uVar23) << 2 != lVar29; lVar29 = lVar29 + 4) {
      fVar18 = postOrderPartial[(long)iVar31 + lVar29 + 1];
      fVar19 = postOrderPartial[iVar31 + lVar29];
      fVar20 = postOrderPartial[(long)iVar31 + lVar29 + 2];
      fVar21 = postOrderPartial[(long)iVar31 + lVar29 + 3];
      fVar22 = preOrderPartial[(long)iVar31 + lVar29 + 3];
      auVar33 = vmulss_avx512f(ZEXT416((uint)fVar6),ZEXT416((uint)fVar18));
      auVar34 = vmulss_avx512f(ZEXT416((uint)fVar2),ZEXT416((uint)fVar18));
      auVar37 = ZEXT416((uint)fVar18);
      auVar35 = vmulss_avx512f(ZEXT416((uint)fVar10),auVar37);
      auVar36 = vmulss_avx512f(ZEXT416((uint)fVar14),auVar37);
      auVar37 = vmulss_avx512f(auVar37,ZEXT416((uint)preOrderPartial[(long)iVar31 + lVar29 + 1]));
      auVar33 = vfmadd231ss_avx512f(auVar33,ZEXT416((uint)fVar5),ZEXT416((uint)fVar19));
      auVar34 = vfmadd231ss_avx512f(auVar34,ZEXT416((uint)fVar1),ZEXT416((uint)fVar19));
      auVar38 = ZEXT416((uint)fVar19);
      auVar37 = vfmadd231ss_avx512f(auVar37,ZEXT416((uint)preOrderPartial[iVar31 + lVar29]),auVar38)
      ;
      auVar35 = vfmadd231ss_avx512f(auVar35,ZEXT416((uint)fVar9),auVar38);
      auVar36 = vfmadd231ss_avx512f(auVar36,ZEXT416((uint)fVar13),auVar38);
      auVar33 = vfmadd231ss_avx512f(auVar33,ZEXT416((uint)fVar7),ZEXT416((uint)fVar20));
      auVar34 = vfmadd231ss_avx512f(auVar34,ZEXT416((uint)fVar3),ZEXT416((uint)fVar20));
      auVar38 = ZEXT416((uint)fVar20);
      auVar37 = vfmadd231ss_avx512f(auVar37,ZEXT416((uint)preOrderPartial[(long)iVar31 + lVar29 + 2]
                                                   ),auVar38);
      auVar35 = vfmadd231ss_avx512f(auVar35,ZEXT416((uint)fVar11),auVar38);
      auVar36 = vfmadd231ss_avx512f(auVar36,ZEXT416((uint)fVar15),auVar38);
      auVar33 = vfmadd231ss_avx512f(auVar33,ZEXT416((uint)fVar8),ZEXT416((uint)fVar21));
      auVar37 = vfmadd231ss_avx512f(auVar37,ZEXT416((uint)fVar22),ZEXT416((uint)fVar21));
      auVar37 = vfmadd213ss_avx512f(auVar37,ZEXT416((uint)fVar17),
                                    ZEXT416(*(uint *)((long)pfVar27 + lVar29)));
      auVar38 = ZEXT416((uint)fVar21);
      auVar34 = vfmadd231ss_avx512f(auVar34,ZEXT416((uint)fVar4),auVar38);
      auVar35 = vfmadd231ss_avx512f(auVar35,ZEXT416((uint)fVar12),auVar38);
      auVar36 = vfmadd231ss_avx512f(auVar36,ZEXT416((uint)fVar16),auVar38);
      auVar33 = vmulss_avx512f(auVar33,ZEXT416((uint)preOrderPartial[(long)iVar31 + lVar29 + 1]));
      auVar33 = vfmadd231ss_avx512f(auVar33,ZEXT416((uint)preOrderPartial[iVar31 + lVar29]),auVar34)
      ;
      auVar33 = vfmadd231ss_avx512f(auVar33,ZEXT416((uint)preOrderPartial[(long)iVar31 + lVar29 + 2]
                                                   ),auVar35);
      *(int *)((long)pfVar27 + lVar29) = auVar37._0_4_;
      auVar33 = vfmadd231ss_avx512f(auVar33,ZEXT416((uint)fVar22),auVar36);
      auVar33 = vfmadd213ss_avx512f(auVar33,ZEXT416((uint)fVar17),
                                    ZEXT416(*(uint *)((long)pfVar28 + lVar29)));
      *(int *)((long)pfVar28 + lVar29) = auVar33._0_4_;
    }
    lVar32 = lVar32 + 0x14;
    iVar31 = iVar31 + iVar25 * 4;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogDerivativesPartials(const REALTYPE *postOrderPartial,
                                                                             const REALTYPE *preOrderPartial,
                                                                             const int firstDerivativeIndex,
                                                                             const int secondDerivativeIndex,
                                                                             const double *categoryRates,
                                                                             const REALTYPE *categoryWeights,
                                                                             const int scalingFactorsIndex,
                                                                             double *outDerivatives,
                                                                             double *outSumDerivatives,
                                                                             double *outSumSquaredDerivatives) {

    const REALTYPE* transMatrix = gTransitionMatrices[firstDerivativeIndex];

    int w = 0;
    for(int l = 0; l < kCategoryCount; l++) {

        int v = l*kPaddedPatternCount*4;

        const REALTYPE weight = categoryWeights[l];

        PREFETCH_MATRIX(1,transMatrix,w); // TODO Use _TRANSPOSE and then reverse integration below

        for(int k = 0; k < kPatternCount; k++) {

            PREFETCH_PARTIALS(1, postOrderPartial,v);
            PREFETCH_PARTIALS(0, preOrderPartial, v);


            DO_INTEGRATION(1);

//            grandNumeratorDerivTmp[k] += (sum10 * prePartials[v] + sum11 * prePartials[v + 1]
//                    + sum12 * prePartials[v + 2] + sum13 * prePartials[v + 3]) * weight;
//            grandDenominatorDerivTmp[k] += (postPartials[v] * prePartials[v] + postPartials[v + 1] * prePartials[v + 1]
//                    + postPartials[v + 2] * prePartials[v + 2] + postPartials[v + 3] * prePartials[v + 3]) * weight;

            grandDenominatorDerivTmp[k] += (p10 * p00 + p11 * p01 + p12 * p02 + p13 * p03) * weight;
            grandNumeratorDerivTmp[k] += (sum10 * p00 + sum11 * p01 + sum12 * p02 + sum13 * p03) * weight;

            v += 4;
        }
        w += OFFSET*4;
    }
}